

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_base_tableref.cpp
# Opt level: O2

QualifiedName * __thiscall
duckdb::Transformer::TransformQualifiedName
          (QualifiedName *__return_storage_ptr__,Transformer *this,PGRangeVar *root)

{
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  QualifiedName::QualifiedName(__return_storage_ptr__);
  ::std::__cxx11::string::assign((char *)__return_storage_ptr__);
  ::std::__cxx11::string::assign((char *)&__return_storage_ptr__->schema);
  if (root->relname == (char *)0x0) {
    local_38 = local_28;
    local_30 = 0;
    local_28[0] = 0;
    ::std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    ::std::__cxx11::string::assign((char *)&__return_storage_ptr__->name);
  }
  return __return_storage_ptr__;
}

Assistant:

QualifiedName Transformer::TransformQualifiedName(duckdb_libpgquery::PGRangeVar &root) {
	QualifiedName qname;
	if (root.catalogname) {
		qname.catalog = root.catalogname;
	} else {
		qname.catalog = INVALID_CATALOG;
	}
	if (root.schemaname) {
		qname.schema = root.schemaname;
	} else {
		qname.schema = INVALID_SCHEMA;
	}
	if (root.relname) {
		qname.name = root.relname;
	} else {
		qname.name = string();
	}
	return qname;
}